

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O1

void __thiscall FuncInfo::EndRecordingOutArgs(FuncInfo *this,ArgSlot argCount)

{
  uint32 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegSlot RVar5;
  
  if (this->outArgsDepth == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x26e,"(outArgsDepth > 0)","mismatched Start and End");
    if (!bVar3) goto LAB_008283e6;
    *puVar4 = 0;
  }
  if (this->outArgsCurrentExpr < (uint)argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x26f,"(outArgsCurrentExpr >= argCount)","outArgsCurrentExpr >= argCount");
    if (!bVar3) goto LAB_008283e6;
    *puVar4 = 0;
  }
  RVar5 = ~(uint)argCount + this->outArgsCurrentExpr;
  puVar1 = &this->outArgsDepth;
  *puVar1 = *puVar1 - 1;
  this->outArgsCurrentExpr = RVar5;
  if (RVar5 != 0 && *puVar1 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x276,"(outArgsDepth != 0 || outArgsCurrentExpr == 0)",
                       "outArgsDepth != 0 || outArgsCurrentExpr == 0");
    if (!bVar3) {
LAB_008283e6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void EndRecordingOutArgs(Js::ArgSlot argCount)
    {
        AssertMsg(outArgsDepth > 0, "mismatched Start and End");
        Assert(outArgsCurrentExpr >= argCount);
#if DBG
        outArgsDepth--;
#endif
        // Add one to pop the space to save the m_outParams pointer
        outArgsCurrentExpr -= (argCount + 1);

        Assert(outArgsDepth != 0 || outArgsCurrentExpr == 0);
    }